

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_sequential_encoder.cc
# Opt level: O1

bool __thiscall
draco::PointCloudSequentialEncoder::GenerateAttributesEncoder
          (PointCloudSequentialEncoder *this,int32_t att_id)

{
  ValueType VVar1;
  tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_> this_00;
  pointer *__ptr;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> local_28;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> local_20
  ;
  
  if (att_id == 0) {
    this_00.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          )operator_new(0xa8);
    local_28._M_head_impl = (PointsSequencer *)operator_new(0x18);
    VVar1 = ((this->super_PointCloudEncoder).point_cloud_)->num_points_;
    (local_28._M_head_impl)->out_point_ids_ =
         (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *)0x0;
    (local_28._M_head_impl)->_vptr_PointsSequencer = (_func_int **)&PTR__PointsSequencer_001dfaa0;
    *(ValueType *)&local_28._M_head_impl[1]._vptr_PointsSequencer = VVar1;
    SequentialAttributeEncodersController::SequentialAttributeEncodersController
              ((SequentialAttributeEncodersController *)
               this_00.
               super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
               .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl,
               (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               &local_28,0);
    local_20._M_t.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
         (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
         this_00.
         super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
         .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>,std::allocator<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>>>
    ::
    emplace_back<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>>
              ((vector<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>,std::allocator<std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>>>
                *)&(this->super_PointCloudEncoder).attributes_encoders_,
               (unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                *)&local_20);
    if ((_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
         )local_20._M_t.
          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl !=
        (AttributesEncoder *)0x0) {
      (**(code **)(*(long *)local_20._M_t.
                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                            .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl +
                  8))();
    }
    local_20._M_t.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
         (_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          )0x0;
    if (local_28._M_head_impl != (PointsSequencer *)0x0) {
      (*(local_28._M_head_impl)->_vptr_PointsSequencer[1])();
    }
  }
  else {
    AttributesEncoder::AddAttributeId
              ((AttributesEncoder *)
               (((this->super_PointCloudEncoder).attributes_encoders_.
                 super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
               ._M_t,att_id);
  }
  return true;
}

Assistant:

bool PointCloudSequentialEncoder::GenerateAttributesEncoder(int32_t att_id) {
  // Create only one attribute encoder that is going to encode all points in a
  // linear sequence.
  if (att_id == 0) {
    // Create a new attribute encoder only for the first attribute.
    AddAttributesEncoder(std::unique_ptr<AttributesEncoder>(
        new SequentialAttributeEncodersController(
            std::unique_ptr<PointsSequencer>(
                new LinearSequencer(point_cloud()->num_points())),
            att_id)));
  } else {
    // Reuse the existing attribute encoder for other attributes.
    attributes_encoder(0)->AddAttributeId(att_id);
  }
  return true;
}